

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

int al_fputs(ALLEGRO_FILE *f,char *p)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar2 = strlen(p);
  f->ungetc_len = 0;
  sVar3 = (*f->vtable->fi_fwrite)(f,p,sVar2);
  sVar1 = 0xffffffffffffffff;
  if (sVar3 == sVar2) {
    sVar1 = sVar2;
  }
  return (int)sVar1;
}

Assistant:

int al_fputs(ALLEGRO_FILE *f, char const *p)
{
   size_t n;
   ASSERT(f);
   ASSERT(p);

   n = strlen(p);
   if (al_fwrite(f, p, n) != n) {
      return EOF;
   }

   return n;
}